

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

int __thiscall AActor::GetTics(AActor *this,FState *newstate)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = FState::GetTics(newstate);
  bVar1 = isFast(this);
  if ((bVar1) && ((newstate->field_0x22 & 4) != 0)) {
    iVar2 = iVar2 - (iVar2 >> 1);
  }
  else {
    bVar1 = isSlow(this);
    if (bVar1) {
      iVar2 = iVar2 << ((byte)newstate->field_0x22 >> 5 & 1);
    }
  }
  return iVar2;
}

Assistant:

int AActor::GetTics(FState * newstate)
{
	int tics = newstate->GetTics();
	if (isFast() && newstate->Fast)
	{
		return tics - (tics>>1);
	}
	else if (isSlow() && newstate->Slow)
	{
		return tics<<1;
	}
	return tics;
}